

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# differentiable.cxx
# Opt level: O0

void __thiscall
DifferentialEquation::setTerm
          (DifferentialEquation *this,int n,StochasticFunction *integrand,
          StochasticVariable *integrator)

{
  value_type pSVar1;
  StochasticVariable *pSVar2;
  reference ppSVar3;
  reference ppSVar4;
  Unit local_160;
  Unit local_f8;
  Unit local_90;
  value_type local_28;
  StochasticVariable *integrator_local;
  StochasticFunction *integrand_local;
  DifferentialEquation *pDStack_10;
  int n_local;
  DifferentialEquation *this_local;
  
  local_28 = integrator;
  integrator_local = (StochasticVariable *)integrand;
  integrand_local._4_4_ = n;
  pDStack_10 = this;
  if (n < this->eqnTermAmount) {
    ppSVar3 = std::vector<StochasticFunction_*,_std::allocator<StochasticFunction_*>_>::operator[]
                        (&this->eqnIntegrands,(long)n);
    if (*ppSVar3 != (value_type)0x0) {
      (*((*ppSVar3)->super_StochasticProcess).super_Parametric._vptr_Parametric[1])();
    }
    pSVar2 = integrator_local;
    ppSVar3 = std::vector<StochasticFunction_*,_std::allocator<StochasticFunction_*>_>::operator[]
                        (&this->eqnIntegrands,(long)integrand_local._4_4_);
    *ppSVar3 = (value_type)pSVar2;
  }
  if (integrand_local._4_4_ < this->eqnTermAmount) {
    ppSVar4 = std::vector<StochasticVariable_*,_std::allocator<StochasticVariable_*>_>::operator[]
                        (&this->eqnIntegrators,(long)integrand_local._4_4_);
    if (*ppSVar4 != (value_type)0x0) {
      (*((*ppSVar4)->super_StochasticProcess).super_Parametric._vptr_Parametric[1])();
    }
    pSVar1 = local_28;
    ppSVar4 = std::vector<StochasticVariable_*,_std::allocator<StochasticVariable_*>_>::operator[]
                        (&this->eqnIntegrators,(long)integrand_local._4_4_);
    *ppSVar4 = pSVar1;
  }
  (*(integrator_local->super_StochasticProcess).super_Physical._vptr_Physical[10])
            (&local_f8,&(integrator_local->super_StochasticProcess).super_Physical);
  (*(local_28->super_StochasticProcess).super_Physical._vptr_Physical[10])
            (&local_160,&(local_28->super_StochasticProcess).super_Physical);
  operator*(&local_90,&local_f8,&local_160);
  Unit::operator+=(&(this->super_StochasticVariable).super_StochasticProcess.super_Physical.
                    physicalUnit,&local_90);
  Unit::~Unit(&local_90);
  Unit::~Unit(&local_160);
  Unit::~Unit(&local_f8);
  return;
}

Assistant:

void DifferentialEquation::setTerm(int n, StochasticFunction *integrand, StochasticVariable *integrator)
{
	if(n<eqnTermAmount) {
		delete eqnIntegrands[n];
		eqnIntegrands[n] = integrand;
	}
	if(n<eqnTermAmount) {
		delete eqnIntegrators[n];
		eqnIntegrators[n] = integrator;
	}
	physicalUnit += integrand->getUnit() * integrator->getUnit();
}